

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.cpp
# Opt level: O0

Attribute * Imf_3_3::Attribute::newAttribute(char *typeName)

{
  bool bVar1;
  ostream *poVar2;
  ArgExc *this;
  pointer ppVar3;
  Attribute *pAVar4;
  char *in_RDI;
  stringstream _iex_throw_s;
  const_iterator i;
  lock_guard<std::mutex> lock;
  LockedTypeMap *tMap;
  stringstream *in_stack_fffffffffffffe08;
  lock_guard<std::mutex> *in_stack_fffffffffffffe10;
  stringstream local_1d0 [16];
  ostream local_1c0 [376];
  iterator local_48;
  _Rb_tree_const_iterator<std::pair<const_char_*const,_Imf_3_3::Attribute_*(*)()>_> local_40 [3];
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_char_*const,_Imf_3_3::Attribute_*(*)()>_> local_20 [2];
  LockedTypeMap *local_10;
  char *local_8;
  
  local_8 = in_RDI;
  local_10 = anon_unknown_0::typeMap();
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_fffffffffffffe10,(mutex_type *)in_stack_fffffffffffffe08);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_char_*,_Imf_3_3::Attribute_*(*)(),_Imf_3_3::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_3_3::Attribute_*(*)()>_>_>
       ::find((map<const_char_*,_Imf_3_3::Attribute_*(*)(),_Imf_3_3::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_3_3::Attribute_*(*)()>_>_>
               *)in_stack_fffffffffffffe08,(key_type *)0x95b9fa);
  std::_Rb_tree_const_iterator<std::pair<const_char_*const,_Imf_3_3::Attribute_*(*)()>_>::
  _Rb_tree_const_iterator(local_20,&local_28);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<const_char_*,_Imf_3_3::Attribute_*(*)(),_Imf_3_3::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_3_3::Attribute_*(*)()>_>_>
       ::end((map<const_char_*,_Imf_3_3::Attribute_*(*)(),_Imf_3_3::(anonymous_namespace)::NameCompare,_std::allocator<std::pair<const_char_*const,_Imf_3_3::Attribute_*(*)()>_>_>
              *)in_stack_fffffffffffffe08);
  std::_Rb_tree_const_iterator<std::pair<const_char_*const,_Imf_3_3::Attribute_*(*)()>_>::
  _Rb_tree_const_iterator(local_40,&local_48);
  bVar1 = std::operator==(local_20,local_40);
  if (!bVar1) {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_char_*const,_Imf_3_3::Attribute_*(*)()>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_char_*const,_Imf_3_3::Attribute_*(*)()>_>
                           *)0x95bb65);
    pAVar4 = (*ppVar3->second)();
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x95bb7e);
    return pAVar4;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_1d0);
  poVar2 = std::operator<<(local_1c0,"Cannot create image file attribute of unknown type \"");
  poVar2 = std::operator<<(poVar2,local_8);
  std::operator<<(poVar2,"\".");
  this = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc(this,in_stack_fffffffffffffe08);
  __cxa_throw(this,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

Attribute*
Attribute::newAttribute (const char typeName[])
{
    LockedTypeMap& tMap = typeMap ();
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (tMap.mutex);
#endif
    TypeMap::const_iterator i = tMap.find (typeName);

    if (i == tMap.end ())
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot create image file attribute of "
            "unknown type \""
                << typeName << "\".");

    return (i->second) ();
}